

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O3

int spng_set_gama_int(spng_ctx *ctx,uint32_t gamma)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = 1;
  if (((ctx != (spng_ctx *)0x0) &&
      (((ctx->data != (uchar *)0x0 || (iVar2 = 0x52, (ctx->field_0xcc & 0x10) != 0)) &&
       (iVar2 = read_chunks(ctx,0), iVar2 == 0)))) && (iVar2 = 1, 0 < (int)gamma)) {
    ctx->gama = gamma;
    uVar1._0_4_ = ctx->user;
    uVar1._4_4_ = ctx->stored;
    ctx->user = (spng_chunk_bitfield)(int)(uVar1 | 0x1000000010);
    ctx->stored = (spng_chunk_bitfield)(int)((uVar1 | 0x1000000010) >> 0x20);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int spng_set_gama_int(spng_ctx *ctx, uint32_t gamma)
{
    SPNG_SET_CHUNK_BOILERPLATE(ctx);

    if(!gamma) return 1;
    if(gamma > spng_u32max) return 1;

    ctx->gama = gamma;

    ctx->stored.gama = 1;
    ctx->user.gama = 1;

    return 0;
}